

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  in_addr prefix;
  char cVar3;
  bool bVar4;
  int iVar5;
  command_result_status cVar6;
  reference pvVar7;
  node<loc_rib_data> *pnVar8;
  undefined1 *puVar9;
  undefined4 extraout_var;
  undefined7 uVar10;
  reference this;
  bgp_client_peer *peer;
  ulong uVar11;
  bgp_client_peer *peer_00;
  pointer pbVar12;
  size_t sVar13;
  pointer pbVar14;
  char *format;
  int iVar15;
  long lVar16;
  int ret;
  in_addr address;
  iterator __end13;
  json conf_json;
  value_type neighbor;
  ifstream conf_file;
  sigaction old_act;
  uchar local_509;
  key_type local_508;
  ulong local_4e8;
  in_addr local_4dc;
  undefined **local_4d8;
  key_type local_4d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4b0;
  key_type local_4a0;
  long local_480;
  undefined1 local_478 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  uint32_t local_458;
  sa_family_t sStack_454;
  in_port_t iStack_452;
  in_addr iStack_450;
  uint32_t uStack_44c;
  uint32_t uStack_448;
  ulong auStack_444 [26];
  in_addr_t local_374;
  undefined8 local_370;
  sigaction local_368;
  istream local_2d0 [520];
  sigaction local_c8;
  
  local_480 = std::chrono::_V2::system_clock::now();
  local_368.__sigaction_handler.sa_handler = signal_handler;
  sigemptyset(&local_368.sa_mask);
  local_368.sa_flags = 0x20000000;
  iVar5 = sigaction(0xe,&local_368,&local_c8);
  if (iVar5 < 0) {
    main_cold_2();
  }
  else {
    log_id = '\0';
    log<>(INFO,"Hello BGP!!");
    fcntl(0,4,0x800);
    std::ifstream::ifstream(local_2d0,"../config.json",_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      local_4b0.m_type = null;
      local_4b0.m_value.object = (object_t *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant(&local_4b0,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant(&local_4b0,true);
      nlohmann::operator>>(local_2d0,&local_4b0);
      std::ifstream::close();
      log<>(INFO,"Succeed to load config");
      local_478._0_8_ = local_478 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"my_as","");
      pvVar7 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&local_4b0,(key_type *)local_478);
      local_508._M_dataplus._M_p = (pointer)((ulong)local_508._M_dataplus._M_p._4_4_ << 0x20);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar7,(int *)&local_508);
      my_as = (uint32_t)local_508._M_dataplus._M_p;
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_468._M_allocated_capacity + 1));
      }
      log<unsigned_int>(INFO,"My AS: %d",&my_as);
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"router-id","");
      pvVar7 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&local_4b0,&local_508);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_478,pvVar7);
      router_id = inet_addr((char *)local_478._0_8_);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_468._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      local_478._0_8_ = inet_ntoa((in_addr)router_id);
      log<char*>(INFO,"Router-ID: %s",(char **)local_478);
      pnVar8 = (node<loc_rib_data> *)malloc(0x30);
      bgp_loc_rib = pnVar8;
      if (pnVar8 == (node<loc_rib_data> *)0x0) {
        log<>(ERROR,"Failed to allocate memory for loc_rib root");
      }
      else {
        uVar11 = 0;
        pnVar8->is_prefix = false;
        pnVar8->prefix = 0;
        pnVar8->prefix_len = '\0';
        pnVar8->data = (loc_rib_data *)0x0;
        pnVar8->parent = (node<loc_rib_data> *)0x0;
        pnVar8->node_0 = (node<loc_rib_data> *)0x0;
        pnVar8->node_1 = (node<loc_rib_data> *)0x0;
        local_4d8 = &PTR_send_0011dd90;
        while( true ) {
          local_478._0_8_ = local_478 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"neighbors","");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(&local_4b0,(key_type *)local_478);
          vVar2 = pvVar7->m_type;
          sVar13 = (size_t)vVar2;
          if (vVar2 != null) {
            if (vVar2 == object) {
              sVar13 = (((pvVar7->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
            }
            else if (vVar2 == array) {
              sVar13 = (long)(((pvVar7->m_value).array)->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(((pvVar7->m_value).array)->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
            }
            else {
              sVar13 = 1;
            }
          }
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,(ulong)(local_468._M_allocated_capacity + 1));
          }
          if (sVar13 <= uVar11) {
            paVar1 = &local_4a0.field_2;
            local_4e8 = 0;
            goto LAB_0010410b;
          }
          local_478._0_8_ = local_478 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"neighbors","");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(&local_4b0,(key_type *)local_478);
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar7,uVar11);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_4a0,pvVar7);
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_,(ulong)(local_468._M_allocated_capacity + 1));
          }
          local_478[9] = '\0';
          local_478[10] = false;
          local_468._M_allocated_capacity = 0;
          local_468._8_8_ = 0;
          local_478._0_8_ = local_4d8;
          uStack_448 = 0;
          auStack_444[0]._0_4_ = 0;
          auStack_444[0]._4_4_ = 0;
          local_458 = 0;
          _sStack_454 = 0;
          iStack_450.s_addr = 0;
          uStack_44c = 0;
          local_478[8] = (uint8_t)uVar11;
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"remote-as","");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_4a0,&local_508);
          local_4d0._M_dataplus._M_p = local_4d0._M_dataplus._M_p & 0xffffffff00000000;
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                    (pvVar7,(uint *)&local_4d0);
          auStack_444[0] = CONCAT44(auStack_444[0]._4_4_,local_4d0._M_dataplus._M_p._0_4_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          local_478[9] = 2;
          sStack_454 = 2;
          local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"address","");
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_4a0,&local_4d0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_508,pvVar7);
          iVar5 = inet_aton(local_508._M_dataplus._M_p,&iStack_450);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          if (iVar5 == 0) {
            log<>(ERROR,"Invalid IP address in config");
            goto LAB_0010473c;
          }
          local_478._9_2_ = local_478._9_2_ & 0xff00;
          puVar9 = (undefined1 *)malloc(0x30);
          if (puVar9 == (undefined1 *)0x0) break;
          *puVar9 = 0;
          *(undefined8 *)(puVar9 + 0x18) = 0;
          *(undefined8 *)(puVar9 + 0x20) = 0;
          *(undefined8 *)(puVar9 + 0x28) = 0;
          auStack_444[0] = auStack_444[0] & 0xffffffff;
          local_468._M_allocated_capacity = (size_type)puVar9;
          std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::push_back
                    (&peers,(value_type *)local_478);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)&local_4a0);
          uVar11 = uVar11 + 1;
        }
        log<>(ERROR,"Failed to allocate memory for adj_ribs_in root");
      }
      goto LAB_0010473c;
    }
  }
  log<>(ERROR,"Failed to open config");
LAB_0010473c:
  exit(1);
LAB_0010410b:
  local_4d8 = (undefined **)std::chrono::_V2::system_clock::now();
  iVar5 = getchar();
  if (console_mode == '\0') {
    iVar15 = iVar5 * 0x1000000;
    uVar10 = (undefined7)(CONCAT44(extraout_var,iVar5) >> 8);
    uVar11 = local_4e8 & 1;
    local_4e8 = CONCAT71(uVar10,iVar15 != -0x1000000);
    if (iVar15 != -0x1000000 && uVar11 == 0) {
      local_4e8 = CONCAT71(uVar10,1);
      if (iVar15 == 0x62000000) {
        raise(2);
      }
      else if (iVar15 == 0x63000000) {
        console_mode = '\x01';
        iVar5 = 1000;
        do {
          getchar();
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        puts("Switched to command mode");
        printf("> ");
      }
      else if (iVar15 == 0x71000000) {
        log<>(INFO,"Good bye");
        peer_00 = peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pbVar14 = peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
LAB_00104692:
        for (; peer_00 != pbVar14; peer_00 = peer_00 + 1) {
          close_client_peer(peer_00);
        }
        log<>(INFO,"Closed all peers");
        pbVar14 = peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                       _M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar14;
            pbVar12 = pbVar12 + 1) {
          free((pbVar12->super_bgp_peer).adj_ribs_in);
        }
        delete_prefix<loc_rib_data>(bgp_loc_rib,false);
        puts("Safety exited");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_4b0);
        std::ifstream::~ifstream(local_2d0);
        return 0;
      }
    }
  }
  else {
    if (main::cmd_str_abi_cxx11_ == '\0') {
      main_cold_1();
    }
    iVar5 = iVar5 << 0x18;
    if (iVar5 != -0x1000000) {
      if ((iVar5 >> 0x18) - 0x20U < 0x5f) {
        std::__cxx11::string::push_back('P');
      }
      else if (iVar5 == 0xa000000) {
        if (main::cmd_str_abi_cxx11_._M_string_length != 0) {
          iVar5 = std::__cxx11::string::compare((char *)&main::cmd_str_abi_cxx11_);
          if (iVar5 == 0) {
            console_mode = '\0';
            puts("Switched to log mode");
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&main::cmd_str_abi_cxx11_);
            if (iVar5 == 0) {
              raise(2);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&main::cmd_str_abi_cxx11_);
              if (iVar5 == 0) {
                lVar16 = std::chrono::_V2::system_clock::now();
                local_478._0_8_ = (lVar16 - local_480) / 1000000000;
                console<long>("Uptime %d seconds",(long *)local_478);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&main::cmd_str_abi_cxx11_);
                if (iVar5 == 0) {
                  console<>("Good bye");
                  peer_00 = peers.
                            super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pbVar14 = peers.
                            super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  goto LAB_00104692;
                }
                iVar5 = std::__cxx11::string::compare((char *)&main::cmd_str_abi_cxx11_);
                if (iVar5 == 0) {
                  if (peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                      _M_impl.super__Vector_impl_data._M_finish !=
                      peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
                    uVar11 = 0;
                    do {
                      local_478._0_8_ = local_478 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_478,"networks","");
                      pvVar7 = nlohmann::
                               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               ::at(&local_4b0,(key_type *)local_478);
                      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                        operator_delete((void *)local_478._0_8_,
                                        (ulong)(local_468._M_allocated_capacity + 1));
                      }
                      local_508._M_string_length = 0;
                      local_508.field_2._M_allocated_capacity = 0;
                      local_508.field_2._8_8_ = 0x8000000000000000;
                      local_508._M_dataplus._M_p = (pointer)pvVar7;
                      nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)&local_508);
                      local_4d0._M_string_length = 0;
                      local_4d0.field_2._M_allocated_capacity = 0;
                      local_4d0.field_2._8_8_ = 0x8000000000000000;
                      local_4d0._M_dataplus._M_p = (pointer)pvVar7;
                      nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_4d0);
                      while( true ) {
                        bVar4 = nlohmann::detail::
                                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::
                                operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                          ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&local_508,
                                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&local_4d0);
                        if (bVar4) break;
                        this = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            *)&local_508);
                        local_4dc.s_addr = 0;
                        local_4a0._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_4a0,"prefix","");
                        pvVar7 = nlohmann::
                                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 ::at(this,&local_4a0);
                        nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::
                        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                  (local_478,pvVar7);
                        iVar5 = inet_aton((char *)local_478._0_8_,&local_4dc);
                        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                          operator_delete((void *)local_478._0_8_,
                                          (ulong)(local_468._M_allocated_capacity + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4a0._M_dataplus._M_p != paVar1) {
                          operator_delete(local_4a0._M_dataplus._M_p,
                                          local_4a0.field_2._M_allocated_capacity + 1);
                        }
                        if (iVar5 == 0) {
                          log<>(ERROR,"Invalid IP address in config");
                          goto LAB_0010473c;
                        }
                        memset(local_478 + 4,0,0x10c);
                        local_478._0_8_ = local_478._0_8_ & 0xffffffffffff0000;
                        local_374 = inet_addr("172.16.3.0");
                        prefix.s_addr = local_4dc.s_addr;
                        local_370._0_4_ = 100;
                        local_370._4_4_ = 0;
                        pbVar14 = peers.
                                  super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar11;
                        local_4a0._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_4a0,"prefix-length","");
                        pvVar7 = nlohmann::
                                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 ::at(this,&local_4a0);
                        local_509 = '\0';
                        nlohmann::detail::
                        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
                                  (pvVar7,&local_509);
                        send_update_with_nlri
                                  (&pbVar14->super_bgp_peer,(attributes *)local_478,prefix.s_addr,
                                   local_509);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4a0._M_dataplus._M_p != paVar1) {
                          operator_delete(local_4a0._M_dataplus._M_p,
                                          local_4a0.field_2._M_allocated_capacity + 1);
                        }
                        nlohmann::detail::
                        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_508);
                      }
                      uVar11 = uVar11 + 1;
                    } while (uVar11 < (ulong)((long)peers.
                                                  super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)peers.
                                                  super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 6));
                  }
                }
                else {
                  cVar6 = execute_command(&main::cmd_str_abi_cxx11_);
                  format = "Invalid parameters";
                  if (cVar6 != INVALID_PARAMS) {
                    if (cVar6 != NOT_FOUND) goto LAB_001045a9;
                    format = "Command not found";
                  }
                  console<>(format);
                }
              }
            }
          }
        }
LAB_001045a9:
        main::cmd_str_abi_cxx11_._M_string_length = 0;
        *main::cmd_str_abi_cxx11_._M_dataplus._M_p = '\0';
        if (console_mode == '\x01') {
          printf("> ");
        }
      }
    }
  }
  if (peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar16 = 0;
    uVar11 = 0;
    do {
      log_id = (uint8_t)uVar11;
      bgp_client_loop((bgp_client_peer *)
                      (((peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->server_address).sin_zero +
                      lVar16 + -0x2c));
      uVar11 = uVar11 + 1;
      lVar16 = lVar16 + 0x40;
    } while (uVar11 < (ulong)((long)peers.
                                    super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)peers.
                                    super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  log_id = 0xff;
  lVar16 = std::chrono::_V2::system_clock::now();
  uVar11 = (lVar16 - (long)local_4d8) / 1000;
  if (uVar11 < 100) {
    usleep(100 - (int)uVar11);
  }
  goto LAB_0010410b;
}

Assistant:

int main(){
    std::chrono::system_clock::time_point up = std::chrono::system_clock::now();

    struct sigaction act, old_act;

    act.sa_handler = signal_handler;
    sigemptyset(&act.sa_mask);
    act.sa_flags = 0;
    act.sa_flags |= SA_INTERRUPT;

    if(sigaction(SIGALRM, &act, &old_act) < 0){
        fprintf(stderr, "Error registering signal disposition\n");
        exit(EXIT_FAILURE);
    }
    log_id = 0;
    log(log_level::INFO, "Hello BGP!!");
    fcntl(0, F_SETFL, O_NONBLOCK);

    std::ifstream conf_file(CONFIG_PATH, std::ios::in);
    if(!conf_file.is_open()){
        log(log_level::ERROR, "Failed to open config");
        exit(EXIT_FAILURE);
    }
    nlohmann::json conf_json;

    try{
        conf_file >> conf_json;
    }catch(nlohmann::detail::exception &e){
        log(log_level::ERROR, "Failed to load config");
        exit(EXIT_FAILURE);
    }
    conf_file.close();

    log(log_level::INFO, "Succeed to load config");

    my_as = conf_json.at("my_as").get<int>();
    log(log_level::INFO, "My AS: %d", my_as);

    router_id = inet_addr(conf_json.at("router-id").get<std::string>().c_str());
    log(log_level::INFO, "Router-ID: %s", inet_ntoa(in_addr{.s_addr = router_id}));

    bgp_loc_rib = (node<loc_rib_data>*) malloc(sizeof(node<loc_rib_data>));
    if(bgp_loc_rib == nullptr){
        log(log_level::ERROR, "Failed to allocate memory for loc_rib root");
        exit(EXIT_FAILURE);
    }
    bgp_loc_rib->is_prefix = false;
    bgp_loc_rib->prefix = 0;
    bgp_loc_rib->prefix_len = 0;
    bgp_loc_rib->data = nullptr;
    bgp_loc_rib->parent = nullptr;
    bgp_loc_rib->node_0 = nullptr;
    bgp_loc_rib->node_1 = nullptr;

    for(int i=0;i<conf_json.at("neighbors").size();i++){
        auto neighbor = conf_json.at("neighbors")[i];
        bgp_client_peer peer;
        peer.index = i;
        peer.sock = 0;
        peer.remote_as = neighbor.at("remote-as");
        peer.state = ACTIVE;
        peer.server_address.sin_family = AF_INET;

        if(inet_aton(neighbor.at("address").get<std::string>().c_str(), &peer.server_address.sin_addr) == 0){
            log(log_level::ERROR, "Invalid IP address in config");
            exit(EXIT_FAILURE);
        }
        peer.state = IDLE;

        auto* root = (node<adj_ribs_in_data>*) malloc(sizeof(node<adj_ribs_in_data>));
        if(root == nullptr){
            log(log_level::ERROR, "Failed to allocate memory for adj_ribs_in root");
            exit(EXIT_FAILURE);
        }
        root->is_prefix = false;
        root->parent = nullptr;
        root->node_0 = nullptr;
        root->node_1 = nullptr;
        peer.adj_ribs_in = root;
        peer.connect_cool_loop_time = 0;
        peers.push_back(peer); // これ、よく見るとブロック抜けたらpeerのメモリ解放されそうだけど、今のところこれで問題が起きたことがないのはなぜだろう
    }

    std::chrono::system_clock::time_point start, now;
    uint64_t real_time;
    bool is_input_continuous = false; // ログモードの時に長いテキストを間違えてペーストしてその中にcやbが含まれていると止まってしまうので、連続で入力された場合は無視するために前回のループで入力があったかを保持する
    while(true){
        start = std::chrono::system_clock::now();
        char input = getchar(); // TODO charの範囲外かもしれない
        if(console_mode == 0){
            if(input == -1){
                is_input_continuous = false;
            }else{
                if(!is_input_continuous){
                    if(input == 'q'){ // TODO ログモードからのプログラム終了は廃止したい
                        log(log_level::INFO, "Good bye");
                        break;
                    }else if(input == 'b'){
                        raise(SIGINT);
                    }else if(input == 'c'){
                        console_mode = 1;
                        for(int i = 0; i < 1000; ++i){
                            getchar(); // 連続入力の対策はしているが、もしかすると連続する文字列がcから始まるかもしれない. その場合、対策をすり抜けてしまうのでへんなコマンドが実行されないようにここでバッファをクリアする
                        }
                        printf("Switched to command mode\n");
                        printf("> ");
                    }
                }
                is_input_continuous = true;
            }
        }else{
            static std::string cmd_str;
            if(input != -1){
                if(input >= 0x20 and input <= 0x7e){
                    cmd_str.push_back(input);
                }else if(input == 0x0a){
                    if(cmd_str.empty()){
                    }else if(cmd_str == "exit"){
                        console_mode = 0;
                        printf("Switched to log mode\n");
                    }else if(cmd_str == "break"){
                        raise(SIGINT);
                    }else if(cmd_str == "uptime"){
                        now = std::chrono::system_clock::now();
                        console("Uptime %d seconds", std::chrono::duration_cast<std::chrono::seconds>(now-up).count());
                    }else if(cmd_str == "shutdown"){
                        console("Good bye");
                        break;
                    }else if(cmd_str == "test"){
                        for(int i = 0; i < peers.size(); ++i){
                            for(auto &network: conf_json.at("networks")){
                                in_addr address = {};
                                if(inet_aton(network.at("prefix").get<std::string>().c_str(), &address) == 0){
                                    log(log_level::ERROR, "Invalid IP address in config");
                                    exit(EXIT_FAILURE);
                                }
                                attributes a;
                                a.origin = IGP;
                                a.as_path_length = 0;
                                a.next_hop = inet_addr("172.16.3.0");
                                a.med = 100;
                                a.local_pref = 0;
                                send_update_with_nlri(&peers[i], &a, address.s_addr, network.at("prefix-length"));
                            }
                        }
                    }else{
                        command_result_status command_result = execute_command(cmd_str);
                        if(command_result == command_result_status::NOT_FOUND){
                            console("Command not found");
                        }else if(command_result == command_result_status::INVALID_PARAMS){
                            console("Invalid parameters");
                        }
                    }
                    cmd_str.clear();
                    if(console_mode == 1){ // Exitされていないなら
                        printf("> ");
                    }
                }
            }
        }

        for(int i = 0; i < peers.size(); ++i){
            log_id = i;
            if(!bgp_client_loop(&peers[i])){
            }
        }
        log_id = 0xff;

        now = std::chrono::system_clock::now();
        real_time = std::chrono::duration_cast<std::chrono::microseconds>(now-start).count();
        if(LOOP_MINIMUM_US > real_time){ // もしこのループにかかった時間がLOOP_MINIMUM_US未満なら
            usleep(LOOP_MINIMUM_US - real_time); //　LOOP_MINIMUM_USに満たない時間分ループが終わるのを待つ
        }
    }

    for(auto & peer : peers){
        close_client_peer(&peer);
    }
    log(log_level::INFO, "Closed all peers");

    for(auto & peer : peers){
        free(peer.adj_ribs_in); // root自体はまだ解放されていないのでここで
    }
    delete_prefix(bgp_loc_rib);
    printf("Safety exited\n");
    return EXIT_SUCCESS;
}